

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O3

int delete_if_not_in_policies(X509_POLICY_NODE *node,void *data)

{
  int iVar1;
  POLICYINFO info;
  ASN1_OBJECT *local_28 [2];
  
  iVar1 = OPENSSL_sk_is_sorted((OPENSSL_STACK *)data);
  if (iVar1 != 0) {
    local_28[0] = node->policy;
    iVar1 = OPENSSL_sk_find((OPENSSL_STACK *)data,(size_t *)0x0,local_28,sk_POLICYINFO_call_cmp_func
                           );
    if (iVar1 == 0) {
      x509_policy_node_free(node);
    }
    return (uint)(iVar1 == 0);
  }
  __assert_fail("sk_POLICYINFO_is_sorted(policies)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                ,0xd2,"int delete_if_not_in_policies(X509_POLICY_NODE *, void *)");
}

Assistant:

static int delete_if_not_in_policies(X509_POLICY_NODE *node, void *data) {
  const CERTIFICATEPOLICIES *policies =
      reinterpret_cast<CERTIFICATEPOLICIES *>(data);
  assert(sk_POLICYINFO_is_sorted(policies));
  POLICYINFO info;
  info.policyid = node->policy;
  if (sk_POLICYINFO_find(policies, NULL, &info)) {
    return 0;
  }
  x509_policy_node_free(node);
  return 1;
}